

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_close(fdb_file_handle *fhandle)

{
  wal_dirty_t wVar1;
  fdb_status fVar2;
  size_t sVar3;
  filemgr *in_RDI;
  fdb_status fs;
  void *in_stack_00000018;
  filemgr *in_stack_00000020;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  fdb_status local_4;
  
  if (in_RDI == (filemgr *)0x0) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    if ((((in_RDI->filename[0x89] & 1U) != 0) && (sVar3 = filemgr_get_ref_count(in_RDI), sVar3 == 1)
        ) && (wVar1 = wal_get_dirty_status(in_RDI), wVar1 == '\x01')) {
      fVar2 = fdb_commit((fdb_file_handle *)
                         CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),'\0');
      if (fVar2 != FDB_RESULT_SUCCESS) {
        return fVar2;
      }
      in_stack_ffffffffffffffec = 0;
    }
    filemgr_fhandle_remove(in_stack_00000020,in_stack_00000018);
    local_4 = _fdb_close_root((fdb_kvs_handle *)
                              CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (local_4 == FDB_RESULT_SUCCESS) {
      fdb_file_handle_close_all((fdb_file_handle *)in_RDI);
      fdb_file_handle_free((fdb_file_handle *)0x146a79);
    }
    else {
      filemgr_fhandle_add(in_stack_00000020,in_stack_00000018);
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_close(fdb_file_handle *fhandle)
{
    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_status fs;
    if (fhandle->root->config.auto_commit &&
        filemgr_get_ref_count(fhandle->root->file) == 1) {
        // auto commit mode & the last handle referring the file
        // commit file before close only if WAL has unflushed data..
        if (wal_get_dirty_status(fhandle->root->file) == FDB_WAL_DIRTY) {
            // Since auto-commit ensures WAL flushed commit, if WAL is dirty
            // then it means that there is uncommitted data present
            fs = fdb_commit(fhandle, FDB_COMMIT_MANUAL_WAL_FLUSH);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }
        }
    }

    filemgr_fhandle_remove(fhandle->root->file, fhandle);
    fs = _fdb_close_root(fhandle->root);
    if (fs == FDB_RESULT_SUCCESS) {
        fdb_file_handle_close_all(fhandle);
        fdb_file_handle_free(fhandle);
    } else {
        filemgr_fhandle_add(fhandle->root->file, fhandle);
    }
    return fs;
}